

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

int yaml_parser_fetch_plain_scalar(yaml_parser_t *parser)

{
  size_t *psVar1;
  yaml_char_t **ppyVar2;
  yaml_token_t **tail;
  byte bVar3;
  byte bVar4;
  size_t sVar5;
  yaml_char_t *pyVar6;
  bool bVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  byte **b_end;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  char *pcVar14;
  uint uVar15;
  long lVar16;
  yaml_token_t *pyVar17;
  uint uVar18;
  yaml_token_t *pyVar19;
  byte bVar20;
  yaml_mark_t start_mark;
  yaml_mark_t end_mark;
  yaml_token_t token;
  byte *local_148;
  byte *pbStack_140;
  byte *local_138 [2];
  byte *local_128;
  byte *pbStack_120;
  byte *local_118 [2];
  byte *local_108;
  byte *pbStack_100;
  byte *local_f8 [2];
  byte *local_e8;
  byte *pbStack_e0;
  byte *local_d8 [2];
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  size_t local_b8;
  size_t local_a8;
  size_t sStack_a0;
  size_t local_98;
  yaml_token_t local_88;
  
  bVar20 = 0;
  iVar9 = yaml_parser_save_simple_key(parser);
  if (iVar9 == 0) {
    return 0;
  }
  parser->simple_key_allowed = 0;
  local_f8[0] = (byte *)0x0;
  local_108 = (byte *)0x0;
  pbStack_100 = (byte *)0x0;
  local_118[0] = (byte *)0x0;
  local_128 = (byte *)0x0;
  pbStack_120 = (byte *)0x0;
  local_138[0] = (byte *)0x0;
  local_148 = (byte *)0x0;
  pbStack_140 = (byte *)0x0;
  local_d8[0] = (byte *)0x0;
  local_e8 = (byte *)0x0;
  pbStack_e0 = (byte *)0x0;
  iVar9 = parser->indent;
  local_108 = (byte *)yaml_malloc(0x10);
  if (local_108 != (byte *)0x0) {
    pbStack_100 = local_108 + 0x10;
    local_108[0] = 0;
    local_108[1] = 0;
    local_108[2] = 0;
    local_108[3] = 0;
    local_108[4] = 0;
    local_108[5] = 0;
    local_108[6] = 0;
    local_108[7] = 0;
    local_108[8] = 0;
    local_108[9] = 0;
    local_108[10] = 0;
    local_108[0xb] = 0;
    local_108[0xc] = 0;
    local_108[0xd] = 0;
    local_108[0xe] = 0;
    local_108[0xf] = 0;
    local_f8[0] = local_108;
    local_128 = (byte *)yaml_malloc(0x10);
    if (local_128 != (byte *)0x0) {
      pbStack_120 = local_128 + 0x10;
      local_128[0] = 0;
      local_128[1] = 0;
      local_128[2] = 0;
      local_128[3] = 0;
      local_128[4] = 0;
      local_128[5] = 0;
      local_128[6] = 0;
      local_128[7] = 0;
      local_128[8] = 0;
      local_128[9] = 0;
      local_128[10] = 0;
      local_128[0xb] = 0;
      local_128[0xc] = 0;
      local_128[0xd] = 0;
      local_128[0xe] = 0;
      local_128[0xf] = 0;
      local_118[0] = local_128;
      local_148 = (byte *)yaml_malloc(0x10);
      if (local_148 != (byte *)0x0) {
        pbStack_140 = local_148 + 0x10;
        local_148[0] = 0;
        local_148[1] = 0;
        local_148[2] = 0;
        local_148[3] = 0;
        local_148[4] = 0;
        local_148[5] = 0;
        local_148[6] = 0;
        local_148[7] = 0;
        local_148[8] = 0;
        local_148[9] = 0;
        local_148[10] = 0;
        local_148[0xb] = 0;
        local_148[0xc] = 0;
        local_148[0xd] = 0;
        local_148[0xe] = 0;
        local_148[0xf] = 0;
        local_138[0] = local_148;
        local_e8 = (byte *)yaml_malloc(0x10);
        if (local_e8 != (byte *)0x0) {
          pbStack_e0 = local_e8 + 0x10;
          local_e8[0] = 0;
          local_e8[1] = 0;
          local_e8[2] = 0;
          local_e8[3] = 0;
          local_e8[4] = 0;
          local_e8[5] = 0;
          local_e8[6] = 0;
          local_e8[7] = 0;
          local_e8[8] = 0;
          local_e8[9] = 0;
          local_e8[10] = 0;
          local_e8[0xb] = 0;
          local_e8[0xc] = 0;
          local_e8[0xd] = 0;
          local_e8[0xe] = 0;
          local_e8[0xf] = 0;
          local_98 = (parser->mark).column;
          local_a8 = (parser->mark).index;
          sStack_a0 = (parser->mark).line;
          local_c8 = (undefined4)(parser->mark).index;
          uStack_c4 = *(undefined4 *)((long)&(parser->mark).index + 4);
          uStack_c0 = (undefined4)(parser->mark).line;
          uStack_bc = *(undefined4 *)((long)&(parser->mark).line + 4);
          local_b8 = (parser->mark).column;
          bVar7 = false;
          local_d8[0] = local_e8;
LAB_00114fd1:
          if ((parser->unread < 4) && (iVar10 = yaml_parser_update_buffer(parser,4), iVar10 == 0))
          goto LAB_00115c60;
          if ((parser->mark).column == 0) {
            pyVar6 = (parser->buffer).pointer;
            if (*pyVar6 == '.') {
              if ((pyVar6[1] == '.') && (pyVar6[2] == '.')) goto LAB_00115a50;
            }
            else if ((*pyVar6 == '-') && ((pyVar6[1] == '-' && (pyVar6[2] == '-')))) {
LAB_00115a50:
              bVar3 = pyVar6[3];
              if (bVar3 == 0xc2) {
                if (pyVar6[4] == 0x85) goto LAB_00115b1c;
              }
              else {
                if (bVar3 != 0xe2) {
                  if ((0x20 < bVar3) || ((0x100002601U >> ((ulong)(uint)bVar3 & 0x3f) & 1) == 0))
                  goto LAB_00114ffe;
                  goto LAB_00115b1c;
                }
                if ((pyVar6[4] == 0x80) && (pyVar6[5] == 0xa8)) goto LAB_00115b1c;
              }
              if (bVar3 == 0) goto LAB_00115b1c;
            }
          }
LAB_00114ffe:
          if (*(parser->buffer).pointer != '#') {
LAB_0011500e:
            pbVar12 = (parser->buffer).pointer;
            bVar3 = *pbVar12;
            uVar18 = (uint)bVar3;
            uVar15 = (uint)bVar3;
            if (bVar3 == 0xc2) {
              if (pbVar12[1] == 0x85) goto LAB_00115467;
LAB_00115077:
              if (uVar18 == 0) goto LAB_00115467;
            }
            else {
              if (uVar15 == 0xe2) {
                if ((pbVar12[1] != 0x80) || (pbVar12[2] != 0xa8)) goto LAB_00115077;
LAB_00115467:
                if (((uVar15 < 0x21) && ((0x100002600U >> ((ulong)uVar15 & 0x3f) & 1) != 0)) ||
                   (((uVar15 == 0xc2 && (pbVar12[1] == 0x85)) ||
                    (((uVar15 == 0xe2 && (pbVar12[1] == 0x80)) && (pbVar12[2] == 0xa8)))))) {
LAB_00115486:
                  do {
                    while( true ) {
                      if ((parser->unread == 0) &&
                         (iVar10 = yaml_parser_update_buffer(parser,1), iVar10 == 0))
                      goto LAB_00115c60;
                      pbVar12 = (parser->buffer).pointer;
                      bVar3 = *pbVar12;
                      if (0x1f < bVar3) break;
                      if (bVar3 == 9) goto LAB_0011552d;
                      if ((bVar3 != 10) && (bVar3 != 0xd)) goto LAB_00115a90;
LAB_001155c1:
                      if ((parser->unread < 2) &&
                         (iVar10 = yaml_parser_update_buffer(parser,2), iVar10 == 0))
                      goto LAB_00115c60;
                      if (bVar7) {
                        if ((pbStack_140 <= local_138[0] + 5) &&
                           (iVar10 = yaml_string_extend(&local_148,local_138,&pbStack_140),
                           iVar10 == 0)) goto LAB_00115c5a;
                        pbVar13 = local_138[0];
                        pbVar12 = (parser->buffer).pointer;
                        bVar3 = *pbVar12;
                        bVar7 = true;
                        if (bVar3 < 0xc2) {
                          if (bVar3 != 10) goto code_r0x00115638;
                          goto LAB_0011583e;
                        }
                        if ((bVar3 == 0xc2) && (pbVar12[1] == 0x85)) {
                          local_138[0] = local_138[0] + 1;
                          goto LAB_0011594f;
                        }
                      }
                      else {
                        local_d8[0] = local_e8;
                        memset(local_e8,0,(long)pbStack_e0 - (long)local_e8);
                        if ((pbStack_120 <= local_118[0] + 5) &&
                           (iVar10 = yaml_string_extend(&local_128,local_118,&pbStack_120),
                           iVar10 == 0)) goto LAB_00115c5a;
                        pbVar12 = (parser->buffer).pointer;
                        bVar3 = *pbVar12;
                        bVar7 = true;
                        pbVar13 = local_118[0];
                        if (bVar3 < 0xc2) {
                          if (bVar3 == 10) {
LAB_00115916:
                            local_118[0] = local_118[0] + 1;
                            goto LAB_00115924;
                          }
                          if (bVar3 == 0xd) {
                            if (pbVar12[1] != 10) goto LAB_00115916;
                            local_118[0] = local_118[0] + 1;
                            goto LAB_001157f6;
                          }
                        }
                        else if ((bVar3 == 0xc2) && (pbVar12[1] == 0x85)) {
                          local_118[0] = local_118[0] + 1;
LAB_0011594f:
                          *pbVar13 = 10;
                          ppyVar2 = &(parser->buffer).pointer;
                          *ppyVar2 = *ppyVar2 + 2;
                          goto LAB_001159ea;
                        }
                      }
                    }
                    if (bVar3 != 0x20) {
                      if (bVar3 == 0xe2) {
                        if ((pbVar12[1] != 0x80) || (pbVar12[2] != 0xa8)) goto LAB_00115a90;
                      }
                      else if ((bVar3 != 0xc2) || (pbVar12[1] != 0x85)) goto LAB_00115a90;
                      if ((bVar3 != 0x20) && (bVar3 != 9)) goto LAB_001155c1;
                    }
LAB_0011552d:
                    if (bVar7) {
                      sVar5 = (parser->mark).column;
                      if (bVar3 == 9 && (int)sVar5 <= iVar9) {
                        parser->error = YAML_SCANNER_ERROR;
                        parser->context = "while scanning a plain scalar";
                        (parser->context_mark).index = CONCAT44(uStack_c4,local_c8);
                        (parser->context_mark).line = CONCAT44(uStack_bc,uStack_c0);
                        (parser->context_mark).column = local_b8;
                        pcVar14 = "found a tab character that violate indentation";
LAB_00115d16:
                        parser->problem = pcVar14;
                        sVar5 = (parser->mark).line;
                        (parser->problem_mark).index = (parser->mark).index;
                        (parser->problem_mark).line = sVar5;
                        (parser->problem_mark).column = (parser->mark).column;
                        goto LAB_00115c60;
                      }
                      (parser->mark).index = (parser->mark).index + 1;
                      (parser->mark).column = sVar5 + 1;
                      parser->unread = parser->unread - 1;
                      bVar3 = *pbVar12;
                      lVar16 = 1;
                      if ((((char)bVar3 < '\0') && (lVar16 = 2, (bVar3 & 0xe0) != 0xc0)) &&
                         (lVar16 = 3, (bVar3 & 0xf0) != 0xe0)) {
                        lVar16 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
                      }
                      (parser->buffer).pointer = pbVar12 + lVar16;
                      bVar7 = true;
                    }
                    else {
                      if ((pbStack_e0 <= local_d8[0] + 5) &&
                         (iVar10 = yaml_string_extend(&local_e8,local_d8,&pbStack_e0), iVar10 == 0))
                      goto LAB_00115c5a;
                      pbVar12 = (parser->buffer).pointer;
                      bVar3 = *pbVar12;
                      if ((char)bVar3 < '\0') {
                        if ((bVar3 & 0xe0) == 0xc0) {
LAB_0011570d:
                          (parser->buffer).pointer = pbVar12 + 1;
                          *local_d8[0] = *pbVar12;
                          pbVar12 = (parser->buffer).pointer;
                          local_d8[0] = local_d8[0] + 1;
                          goto LAB_00115731;
                        }
                        if ((bVar3 & 0xf0) == 0xe0) {
LAB_001156e9:
                          (parser->buffer).pointer = pbVar12 + 1;
                          *local_d8[0] = *pbVar12;
                          pbVar12 = (parser->buffer).pointer;
                          local_d8[0] = local_d8[0] + 1;
                          goto LAB_0011570d;
                        }
                        if ((bVar3 & 0xf8) == 0xf0) {
                          (parser->buffer).pointer = pbVar12 + 1;
                          *local_d8[0] = *pbVar12;
                          pbVar12 = (parser->buffer).pointer;
                          local_d8[0] = local_d8[0] + 1;
                          goto LAB_001156e9;
                        }
                      }
                      else {
LAB_00115731:
                        (parser->buffer).pointer = pbVar12 + 1;
                        *local_d8[0] = *pbVar12;
                        local_d8[0] = local_d8[0] + 1;
                      }
                      (parser->mark).index = (parser->mark).index + 1;
                      psVar1 = &(parser->mark).column;
                      *psVar1 = *psVar1 + 1;
                      parser->unread = parser->unread - 1;
                      bVar7 = false;
                    }
                  } while( true );
                }
                goto LAB_00115b1c;
              }
              if ((uVar15 < 0x21) && ((0x100002601U >> ((ulong)uVar18 & 0x3f) & 1) != 0))
              goto LAB_00115467;
            }
            if (uVar18 == 0x3a && parser->flow_level != 0) {
              uVar18 = pbVar12[1] - 0x3f;
              if (((uVar18 < 0x3f) && ((0x5000000050000001U >> ((ulong)uVar18 & 0x3f) & 1) != 0)) ||
                 (pbVar12[1] == 0x2c)) {
                parser->error = YAML_SCANNER_ERROR;
                parser->context = "while scanning a plain scalar";
                (parser->context_mark).index = CONCAT44(uStack_c4,local_c8);
                (parser->context_mark).line = CONCAT44(uStack_bc,uStack_c0);
                (parser->context_mark).column = local_b8;
                pcVar14 = "found unexpected \':\'";
                goto LAB_00115d16;
              }
            }
            if (uVar15 == 0x3a) {
              bVar4 = pbVar12[1];
              if (bVar4 == 0xc2) {
                if (pbVar12[2] == 0x85) goto LAB_00115467;
              }
              else {
                if (bVar4 != 0xe2) {
                  if ((0x20 < bVar4) || ((0x100002601U >> ((ulong)(uint)bVar4 & 0x3f) & 1) == 0))
                  goto LAB_00115133;
                  goto LAB_00115467;
                }
                if ((pbVar12[2] == 0x80) && (pbVar12[3] == 0xa8)) goto LAB_00115467;
              }
              if (bVar4 == 0) goto LAB_00115467;
            }
LAB_00115133:
            if ((parser->flow_level != 0) &&
               (((bVar3 - 0x3f < 0x3f &&
                 ((0x5000000050000001U >> ((ulong)(bVar3 - 0x3f) & 0x3f) & 1) != 0)) ||
                (uVar15 == 0x2c)))) goto LAB_00115467;
            if (bVar7) {
              if (*local_128 == 10) {
                if (*local_148 == 0) {
                  if ((pbStack_100 <= local_f8[0] + 5) &&
                     (iVar10 = yaml_string_extend(&local_108,local_f8,&pbStack_100), iVar10 == 0))
                  goto LAB_00115c5a;
                  pbVar12 = local_f8[0];
                  local_f8[0] = local_f8[0] + 1;
                  *pbVar12 = 0x20;
                }
                else {
                  iVar10 = yaml_string_join(&local_108,local_f8,&pbStack_100,&local_148,local_138,
                                            &pbStack_140);
                  if (iVar10 == 0) goto LAB_00115c5a;
                  local_138[0] = local_148;
                  memset(local_148,0,(long)pbStack_140 - (long)local_148);
                }
                local_118[0] = local_128;
                b_end = &pbStack_120;
                pbVar12 = local_128;
              }
              else {
                iVar10 = yaml_string_join(&local_108,local_f8,&pbStack_100,&local_128,local_118,
                                          &pbStack_120);
                if (iVar10 == 0) goto LAB_00115c5a;
                local_118[0] = local_128;
                b_end = &pbStack_140;
                iVar10 = yaml_string_join(&local_108,local_f8,&pbStack_100,&local_148,local_138,
                                          b_end);
                if (iVar10 == 0) goto LAB_00115c5a;
                local_138[0] = local_148;
                local_118[0] = local_128;
                memset(local_128,0,(long)pbStack_120 - (long)local_128);
                local_138[0] = local_148;
                pbVar12 = local_148;
              }
LAB_0011530e:
              memset(pbVar12,0,(long)*b_end - (long)pbVar12);
            }
            else if (local_e8 != local_d8[0]) {
              b_end = &pbStack_e0;
              iVar10 = yaml_string_join(&local_108,local_f8,&pbStack_100,&local_e8,local_d8,b_end);
              if (iVar10 != 0) {
                local_d8[0] = local_e8;
                pbVar12 = local_e8;
                goto LAB_0011530e;
              }
              goto LAB_00115c5a;
            }
            if ((pbStack_100 <= local_f8[0] + 5) &&
               (iVar10 = yaml_string_extend(&local_108,local_f8,&pbStack_100), iVar10 == 0))
            goto LAB_00115c5a;
            pbVar12 = (parser->buffer).pointer;
            bVar3 = *pbVar12;
            if ((char)bVar3 < '\0') {
              if ((bVar3 & 0xe0) == 0xc0) {
LAB_001153c6:
                (parser->buffer).pointer = pbVar12 + 1;
                *local_f8[0] = *pbVar12;
                pbVar12 = (parser->buffer).pointer;
                local_f8[0] = local_f8[0] + 1;
                goto LAB_001153ea;
              }
              if ((bVar3 & 0xf0) == 0xe0) {
LAB_001153a2:
                (parser->buffer).pointer = pbVar12 + 1;
                *local_f8[0] = *pbVar12;
                pbVar12 = (parser->buffer).pointer;
                local_f8[0] = local_f8[0] + 1;
                goto LAB_001153c6;
              }
              if ((bVar3 & 0xf8) == 0xf0) {
                (parser->buffer).pointer = pbVar12 + 1;
                *local_f8[0] = *pbVar12;
                pbVar12 = (parser->buffer).pointer;
                local_f8[0] = local_f8[0] + 1;
                goto LAB_001153a2;
              }
            }
            else {
LAB_001153ea:
              (parser->buffer).pointer = pbVar12 + 1;
              *local_f8[0] = *pbVar12;
              local_f8[0] = local_f8[0] + 1;
            }
            (parser->mark).index = (parser->mark).index + 1;
            psVar1 = &(parser->mark).column;
            *psVar1 = *psVar1 + 1;
            uVar11 = parser->unread - 1;
            parser->unread = uVar11;
            local_98 = (parser->mark).column;
            local_a8 = (parser->mark).index;
            sStack_a0 = (parser->mark).line;
            bVar7 = false;
            if ((uVar11 < 2) && (iVar10 = yaml_parser_update_buffer(parser,2), iVar10 == 0))
            goto LAB_00115c60;
            goto LAB_0011500e;
          }
          goto LAB_00115b1c;
        }
      }
    }
  }
LAB_00115c5a:
  parser->error = YAML_MEMORY_ERROR;
LAB_00115c60:
  yaml_free(local_108);
  local_f8[0] = (byte *)0x0;
  local_108 = (byte *)0x0;
  pbStack_100 = (byte *)0x0;
  yaml_free(local_128);
  local_118[0] = (byte *)0x0;
  local_128 = (byte *)0x0;
  pbStack_120 = (byte *)0x0;
  yaml_free(local_148);
  local_138[0] = (byte *)0x0;
  local_148 = (byte *)0x0;
  pbStack_140 = (byte *)0x0;
  yaml_free(local_e8);
  return 0;
LAB_00115a90:
  if ((parser->flow_level == 0) && ((int)(parser->mark).column <= iVar9)) {
LAB_00115b1c:
    local_88.type = YAML_SCALAR_TOKEN;
    local_88._4_4_ = 0;
    local_88.start_mark.index = CONCAT44(uStack_c4,local_c8);
    local_88.start_mark.line = CONCAT44(uStack_bc,uStack_c0);
    local_88.start_mark.column = local_b8;
    local_88.end_mark.index = local_a8;
    local_88.end_mark.line = sStack_a0;
    local_88.end_mark.column = local_98;
    local_88.data.tag.handle = local_108;
    local_88.data.tag.suffix = local_f8[0] + -(long)local_108;
    local_88.data._16_8_ = 1;
    if (bVar7) {
      parser->simple_key_allowed = 1;
    }
    yaml_free(local_128);
    local_118[0] = (byte *)0x0;
    local_128 = (byte *)0x0;
    pbStack_120 = (byte *)0x0;
    yaml_free(local_148);
    local_138[0] = (byte *)0x0;
    local_148 = (byte *)0x0;
    pbStack_140 = (byte *)0x0;
    yaml_free(local_e8);
    tail = &(parser->tokens).tail;
    if (((parser->tokens).tail == (parser->tokens).end) &&
       (iVar9 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                  &(parser->tokens).end), iVar9 == 0)) {
      parser->error = YAML_MEMORY_ERROR;
      yaml_token_delete(&local_88);
      return 0;
    }
    pyVar19 = *tail;
    *tail = pyVar19 + 1;
    pyVar17 = &local_88;
    for (lVar16 = 10; lVar16 != 0; lVar16 = lVar16 + -1) {
      uVar8 = *(undefined4 *)&pyVar17->field_0x4;
      pyVar19->type = pyVar17->type;
      *(undefined4 *)&pyVar19->field_0x4 = uVar8;
      pyVar17 = (yaml_token_t *)((long)pyVar17 + ((ulong)bVar20 * -2 + 1) * 8);
      pyVar19 = (yaml_token_t *)((long)pyVar19 + (ulong)bVar20 * -0x10 + 8);
    }
    return 1;
  }
  goto LAB_00114fd1;
code_r0x00115638:
  if (bVar3 == 0xd) {
    if (pbVar12[1] == 10) {
      local_138[0] = local_138[0] + 1;
LAB_001157f6:
      bVar7 = true;
      *pbVar13 = 10;
      ppyVar2 = &(parser->buffer).pointer;
      *ppyVar2 = *ppyVar2 + 2;
      (parser->mark).index = (parser->mark).index + 2;
      (parser->mark).column = 0;
      psVar1 = &(parser->mark).line;
      *psVar1 = *psVar1 + 1;
      parser->unread = parser->unread - 2;
    }
    else {
LAB_0011583e:
      local_138[0] = local_138[0] + 1;
LAB_00115924:
      *pbVar13 = 10;
      ppyVar2 = &(parser->buffer).pointer;
      *ppyVar2 = *ppyVar2 + 1;
LAB_001159ea:
      bVar7 = true;
      (parser->mark).index = (parser->mark).index + 1;
      (parser->mark).column = 0;
      psVar1 = &(parser->mark).line;
      *psVar1 = *psVar1 + 1;
      parser->unread = parser->unread - 1;
    }
  }
  goto LAB_00115486;
}

Assistant:

static int
yaml_parser_fetch_plain_scalar(yaml_parser_t *parser)
{
    yaml_token_t token;

    /* A plain scalar could be a simple key. */

    if (!yaml_parser_save_simple_key(parser))
        return 0;

    /* A simple key cannot follow a flow scalar. */

    parser->simple_key_allowed = 0;

    /* Create the SCALAR token and append it to the queue. */

    if (!yaml_parser_scan_plain_scalar(parser, &token))
        return 0;

    if (!ENQUEUE(parser, parser->tokens, token)) {
        yaml_token_delete(&token);
        return 0;
    }

    return 1;
}